

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

void tcg_context_init_mipsel(TCGContext_conflict4 *s)

{
  TCGArgConstraint *pTVar1;
  byte bVar2;
  byte bVar3;
  TCGOpDef *pTVar4;
  gpointer pvVar5;
  gpointer pvVar6;
  GHashTable *hash_table;
  GHashTable *pGVar7;
  undefined1 *puVar8;
  int *piVar9;
  jit_code_entry *pjVar10;
  TCGTemp *pTVar11;
  ushort uVar12;
  long lVar13;
  char *name;
  ushort uVar14;
  uint uVar15;
  ushort uVar16;
  _Bool _Var17;
  ulong uVar18;
  byte *pbVar19;
  int oarg;
  uint uVar20;
  byte *pbVar21;
  TCGOpcode op;
  bool bVar22;
  uint in_XCR0;
  
  uVar15 = 0;
  memset(s,0,0x9f50);
  pTVar4 = (TCGOpDef *)g_malloc0(0x1720);
  s->tcg_op_defs = pTVar4;
  memcpy(pTVar4,tcg_op_defs_org,0x1720);
  for (lVar13 = 9; lVar13 != 0x1729; lVar13 = lVar13 + 0x20) {
    uVar15 = uVar15 + *(byte *)((long)&s->tcg_op_defs->name + lVar13) +
             (uint)*(byte *)((long)s->tcg_op_defs + lVar13 + -1);
  }
  pvVar5 = g_malloc0((ulong)uVar15 * 8);
  pvVar6 = g_malloc0((ulong)uVar15 << 2);
  pTVar4 = s->tcg_op_defs;
  for (lVar13 = 0; lVar13 != 0x1720; lVar13 = lVar13 + 0x20) {
    *(gpointer *)((long)&pTVar4->args_ct + lVar13) = pvVar5;
    *(gpointer *)((long)&pTVar4->sorted_args + lVar13) = pvVar6;
    uVar18 = (ulong)((uint)(&pTVar4->nb_oargs)[lVar13] + (uint)(&pTVar4->nb_iargs)[lVar13]);
    pvVar6 = (gpointer)((long)pvVar6 + uVar18 * 4);
    pvVar5 = (gpointer)((long)pvVar5 + uVar18 * 8);
  }
  hash_table = g_hash_table_new((GHashFunc)0x0,(GEqualFunc)0x0);
  s->helper_table = hash_table;
  pGVar7 = g_hash_table_new_full
                     ((GHashFunc)0x0,(GEqualFunc)0x0,(GDestroyNotify)0x0,uc_free_inline_hook_info);
  s->custom_helper_infos = pGVar7;
  for (lVar13 = 0; lVar13 != 0x6e88; lVar13 = lVar13 + 0x18) {
    g_hash_table_insert(hash_table,*(gpointer *)((long)&all_helpers[0].func + lVar13),
                        (gpointer)((long)&all_helpers[0].func + lVar13));
  }
  piVar9 = (int *)cpuid_basic_info(0);
  if (*piVar9 < 7) {
    if (*piVar9 < 1) goto LAB_00721201;
    _Var17 = false;
  }
  else {
    lVar13 = cpuid_Extended_Feature_Enumeration_info(7);
    bVar3 = (byte)*(undefined4 *)(lVar13 + 4);
    have_bmi1_mipsel = (_Bool)(bVar3 >> 3 & 1);
    have_bmi2 = (_Bool)((byte)((uint)*(undefined4 *)(lVar13 + 4) >> 8) & 1);
    _Var17 = (_Bool)(bVar3 >> 5 & 1);
  }
  lVar13 = cpuid_Version_info(1);
  uVar15 = *(uint *)(lVar13 + 0xc);
  have_movbe = (_Bool)((byte)(uVar15 >> 0x16) & 1);
  have_popcnt_mipsel = (_Bool)((byte)(uVar15 >> 0x17) & 1);
  if (((uVar15 >> 0x1b & 1) != 0) && ((~in_XCR0 & 6) == 0)) {
    have_avx1_mipsel = (_Bool)((byte)(uVar15 >> 0x1c) & 1);
    have_avx2_mipsel = _Var17;
  }
LAB_00721201:
  piVar9 = (int *)cpuid(0x8000000);
  if (0 < *piVar9) {
    lVar13 = cpuid(0x80000001);
    have_lzcnt = (_Bool)((byte)*(undefined4 *)(lVar13 + 0xc) >> 5 & 1);
  }
  s->tcg_target_available_regs[0] = 0xffff;
  s->tcg_target_available_regs[1] = 0xffff;
  if (have_avx1_mipsel == true) {
    s->tcg_target_available_regs[2] = 0xffff0000;
    s->tcg_target_available_regs[3] = 0xffff0000;
  }
  if (have_avx2_mipsel == true) {
    s->tcg_target_available_regs[4] = 0xffff0000;
  }
  s->tcg_target_call_clobber_regs = 0xffff0fc7;
  s->reserved_regs = 0x10;
  lVar13 = 0;
  do {
    if (lVar13 == 0xb9) {
      piVar9 = (int *)g_malloc(0x7c);
      s->indirect_reg_alloc_order = piVar9;
      for (name = (char *)0x1e; name != (char *)0xffffffffffffffff; name = name + -1) {
        *piVar9 = tcg_target_reg_alloc_order[(long)name];
        piVar9 = piVar9 + 1;
      }
      pjVar10 = (jit_code_entry *)g_malloc(0x20);
      s->one_entry = pjVar10;
      pjVar10->symfile_addr = (void *)0x0;
      pTVar11 = tcg_global_reg_new_internal(s,TCG_TYPE_COUNT,0xb69415,name);
      s->cpu_env = (TCGv_ptr)((long)pTVar11 - (long)s);
      return;
    }
    bVar3 = s->tcg_op_defs[lVar13].flags;
    if ((bVar3 & 0x20) != 0) goto LAB_007216c7;
    pTVar4 = s->tcg_op_defs + lVar13;
    uVar15 = (uint)pTVar4->nb_oargs + (uint)pTVar4->nb_iargs;
    if (uVar15 == 0) goto LAB_007216c7;
    puVar8 = tcg_target_op_def_r;
    switch((uint)lVar13 & 0xff) {
    case 7:
    case 0x41:
      puVar8 = tcg_target_op_def_setc;
      break;
    case 8:
    case 0x42:
      puVar8 = tcg_target_op_def_movc;
      break;
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0x23:
    case 0x24:
    case 0x30:
    case 0x32:
    case 0x3e:
    case 0x43:
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x60:
    case 99:
    case 100:
    case 0x65:
    case 0x69:
    case 0x6a:
    case 0x6c:
    case 0x6d:
    case 0x7a:
      puVar8 = tcg_target_op_def_r_r;
      break;
    case 0xe:
    case 0x4a:
      puVar8 = tcg_target_op_def_qi_r;
      break;
    case 0xf:
    case 0x10:
    case 0x4b:
    case 0x4c:
      puVar8 = tcg_target_op_def_ri_r;
      break;
    case 0x11:
    case 0x4e:
      puVar8 = tcg_target_op_def_r_r_re;
      break;
    case 0x12:
    case 0x13:
    case 0x1b:
    case 0x1c:
    case 0x4f:
    case 0x50:
    case 0x58:
    case 0x59:
      puVar8 = tcg_target_op_def_r_0_re;
      break;
    default:
      puVar8 = (undefined1 *)0x0;
      break;
    case 0x18:
    case 0x19:
    case 0x55:
    case 0x56:
      puVar8 = tcg_target_op_def_div2;
      break;
    case 0x1a:
    case 0x57:
      puVar8 = tcg_target_op_def_and;
      break;
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x5a:
    case 0x5b:
    case 0x5c:
      puVar8 = tcg_target_op_def_r_0_ci;
      if (have_bmi2 != false) {
        puVar8 = tcg_target_op_def_r_r_ri;
      }
      break;
    case 0x20:
    case 0x21:
    case 0x5d:
    case 0x5e:
      puVar8 = tcg_target_op_def_r_0_ci;
      break;
    case 0x22:
    case 0x5f:
      puVar8 = tcg_target_op_def_dep;
      break;
    case 0x25:
    case 0x62:
      puVar8 = tcg_target_op_def_r_0_r;
      break;
    case 0x26:
    case 0x67:
      puVar8 = tcg_target_op_def_r_re;
      break;
    case 0x27:
    case 0x28:
    case 0x7b:
    case 0x7c:
      puVar8 = tcg_target_op_def_arith2;
      break;
    case 0x29:
    case 0x2a:
    case 0x7d:
    case 0x7e:
      puVar8 = tcg_target_op_def_mul2;
      break;
    case 0x2d:
      puVar8 = tcg_target_op_def_b2;
      break;
    case 0x2e:
      puVar8 = tcg_target_op_def_s2;
      break;
    case 0x2f:
    case 0x31:
    case 0x68:
    case 0x6b:
      puVar8 = tcg_target_op_def_r_q;
      break;
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x66:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
      puVar8 = tcg_target_op_def_r_0;
      break;
    case 0x37:
    case 0x73:
      puVar8 = tcg_target_op_def_andc;
      break;
    case 0x3c:
    case 0x78:
      puVar8 = tcg_target_op_def_clz;
      bVar2 = have_lzcnt;
      goto LAB_00721400;
    case 0x3d:
    case 0x79:
      puVar8 = tcg_target_op_def_ctz;
      bVar2 = have_bmi1_mipsel;
LAB_00721400:
      puVar8 = puVar8 + (ulong)bVar2 * 0x88;
      break;
    case 0x4d:
      puVar8 = tcg_target_op_def_re_r;
      break;
    case 0x84:
      break;
    case 0x85:
    case 0x87:
      puVar8 = tcg_target_op_def_r_L;
      break;
    case 0x86:
    case 0x88:
      puVar8 = tcg_target_op_def_L_L;
      break;
    case 0x8b:
    case 0x94:
    case 0xa3:
    case 0xa4:
    case 0xa5:
    case 0xb5:
      puVar8 = tcg_target_op_def_x_x;
      break;
    case 0x8d:
    case 0x8e:
    case 0x8f:
      puVar8 = tcg_target_op_def_x_r;
      break;
    case 0x90:
    case 0x91:
    case 0x92:
    case 0x95:
    case 0x96:
    case 0x97:
    case 0x98:
    case 0x99:
    case 0x9a:
    case 0x9b:
    case 0x9c:
    case 0x9d:
    case 0x9e:
    case 0x9f:
    case 0xa0:
    case 0xa6:
    case 0xa7:
    case 0xa8:
    case 0xa9:
    case 0xaa:
    case 0xab:
    case 0xac:
    case 0xb0:
    case 0xb2:
    case 0xb3:
    case 0xb4:
    case 0xb6:
    case 0xb7:
    case 0xb8:
      puVar8 = tcg_target_op_def_x_x_x;
      break;
    case 0xb1:
      puVar8 = tcg_target_op_def_x_x_x_x;
    }
    bVar22 = (bVar3 & 0x10) == 0;
    uVar12 = 0x400;
    if (bVar22) {
      uVar12 = 2;
    }
    uVar14 = 0x200;
    if (bVar22) {
      uVar14 = 2;
    }
    uVar16 = 0x100;
    if (bVar22) {
      uVar16 = 2;
    }
    for (uVar18 = 0; uVar18 != uVar15; uVar18 = uVar18 + 1) {
      pbVar19 = *(byte **)(puVar8 + uVar18 * 8 + 8);
      pTVar4->args_ct[uVar18].u.regs = 0;
      pTVar4->args_ct[uVar18].ct = 0;
switchD_00721526_caseD_52:
      while( true ) {
        while( true ) {
          while( true ) {
            bVar3 = *pbVar19;
            uVar20 = bVar3 - 0x30;
            if (9 < uVar20) break;
            pTVar4->args_ct[uVar18] = pTVar4->args_ct[uVar20];
            pTVar1 = pTVar4->args_ct;
            pTVar1[uVar20].ct = pTVar1[uVar20].ct | 0x80;
            pTVar1[uVar20].alias_index = (uint8_t)uVar18;
            *(byte *)&pTVar1[uVar18].ct = (byte)pTVar1[uVar18].ct | 0x40;
            pTVar1[uVar18].alias_index = (uint8_t)uVar20;
            pbVar19 = pbVar19 + 1;
          }
          if (bVar3 != 0x26) break;
          pTVar4->args_ct[uVar18].ct = pTVar4->args_ct[uVar18].ct | 0x20;
          pbVar19 = pbVar19 + 1;
        }
        if (bVar3 != 0x69) break;
        pTVar4->args_ct[uVar18].ct = pTVar4->args_ct[uVar18].ct | 2;
        pbVar19 = pbVar19 + 1;
      }
      if (bVar3 != 0) {
        pTVar1 = pTVar4->args_ct;
        pbVar21 = pbVar19 + 1;
        pbVar19 = (byte *)0x0;
        switch(bVar3) {
        case 0x51:
          *(byte *)&pTVar1[uVar18].ct = (byte)pTVar1[uVar18].ct | 1;
          pTVar1[uVar18].u.regs = 0xf;
          pbVar19 = pbVar21;
          break;
        case 0x52:
        case 0x54:
        case 0x55:
        case 0x56:
        case 0x58:
        case 0x59:
        case 0x5b:
        case 0x5c:
        case 0x5d:
        case 0x5e:
        case 0x5f:
        case 0x60:
          break;
        case 0x53:
          *(byte *)&pTVar1[uVar18].ct = (byte)pTVar1[uVar18].ct | 1;
          *(byte *)&pTVar1[uVar18].u = *(byte *)&pTVar1[uVar18].u | 0x40;
          pbVar19 = pbVar21;
          break;
        case 0x57:
          pbVar19 = (byte *)((long)&pTVar1[uVar18].ct + 1);
          *pbVar19 = *pbVar19 | 8;
          pbVar19 = pbVar21;
          break;
        case 0x5a:
          pTVar1[uVar18].ct = pTVar1[uVar18].ct | uVar14;
          pbVar19 = pbVar21;
          break;
        case 0x61:
          *(byte *)&pTVar1[uVar18].ct = (byte)pTVar1[uVar18].ct | 1;
          *(byte *)&pTVar1[uVar18].u = *(byte *)&pTVar1[uVar18].u | 1;
          pbVar19 = pbVar21;
          break;
        case 0x62:
          *(byte *)&pTVar1[uVar18].ct = (byte)pTVar1[uVar18].ct | 1;
          *(byte *)&pTVar1[uVar18].u = *(byte *)&pTVar1[uVar18].u | 8;
          pbVar19 = pbVar21;
          break;
        case 99:
          *(byte *)&pTVar1[uVar18].ct = (byte)pTVar1[uVar18].ct | 1;
          *(byte *)&pTVar1[uVar18].u = *(byte *)&pTVar1[uVar18].u | 2;
          pbVar19 = pbVar21;
          break;
        case 100:
          *(byte *)&pTVar1[uVar18].ct = (byte)pTVar1[uVar18].ct | 1;
          *(byte *)&pTVar1[uVar18].u = *(byte *)&pTVar1[uVar18].u | 4;
          pbVar19 = pbVar21;
          break;
        case 0x65:
          pTVar1[uVar18].ct = pTVar1[uVar18].ct | uVar16;
          pbVar19 = pbVar21;
          break;
        default:
          if (bVar3 == 0x44) {
            *(byte *)&pTVar1[uVar18].ct = (byte)pTVar1[uVar18].ct | 1;
            *(byte *)&pTVar1[uVar18].u = *(byte *)&pTVar1[uVar18].u | 0x80;
            pbVar19 = pbVar21;
          }
          else if (bVar3 == 0x49) {
            pTVar1[uVar18].ct = pTVar1[uVar18].ct | uVar12;
            pbVar19 = pbVar21;
          }
          else if (bVar3 == 0x4c) {
            *(byte *)&pTVar1[uVar18].ct = (byte)pTVar1[uVar18].ct | 1;
            pTVar1[uVar18].u.regs = 0xff3f;
            pbVar19 = pbVar21;
          }
          else if (bVar3 == 0x71) {
            *(byte *)&pTVar1[uVar18].ct = (byte)pTVar1[uVar18].ct | 1;
            pTVar1[uVar18].u.regs = 0xffff;
            pbVar19 = pbVar21;
          }
          else if (bVar3 == 0x72) {
            *(byte *)&pTVar1[uVar18].ct = (byte)pTVar1[uVar18].ct | 1;
            pTVar1[uVar18].u.regs = pTVar1[uVar18].u.regs | 0xffff;
            pbVar19 = pbVar21;
          }
          else if (bVar3 == 0x78) {
            *(byte *)&pTVar1[uVar18].ct = (byte)pTVar1[uVar18].ct | 1;
            pTVar1[uVar18].u.regs = pTVar1[uVar18].u.regs | 0xffff0000;
            pbVar19 = pbVar21;
          }
        }
        goto switchD_00721526_caseD_52;
      }
    }
    sort_constraints(pTVar4,0,(uint)pTVar4->nb_oargs);
    sort_constraints(pTVar4,(uint)pTVar4->nb_oargs,(uint)pTVar4->nb_iargs);
LAB_007216c7:
    lVar13 = lVar13 + 1;
  } while( true );
}

Assistant:

void tcg_context_init(TCGContext *s)
{
    int op, total_args, n, i;
    TCGOpDef *def;
    TCGArgConstraint *args_ct;
    int *sorted_args;
    TCGTemp *ts;
    GHashTable *helper_table;

    memset(s, 0, sizeof(*s));
    s->nb_globals = 0;

    // copy original tcg_op_defs_org for private usage
    s->tcg_op_defs = g_malloc0(sizeof(tcg_op_defs_org));
    memcpy(s->tcg_op_defs, tcg_op_defs_org, sizeof(tcg_op_defs_org));

    /* Count total number of arguments and allocate the corresponding
       space */
    total_args = 0;
    for(op = 0; op < NB_OPS; op++) {
        def = &s->tcg_op_defs[op];
        n = def->nb_iargs + def->nb_oargs;
        total_args += n;
    }

    args_ct = g_malloc0(sizeof(TCGArgConstraint) * total_args);
    sorted_args = g_malloc0(sizeof(int) * total_args);

    for(op = 0; op < NB_OPS; op++) {
        def = &s->tcg_op_defs[op];
        def->args_ct = args_ct;
        def->sorted_args = sorted_args;
        n = def->nb_iargs + def->nb_oargs;
        sorted_args += n;
        args_ct += n;
    }

    /* Register helpers.  */
    /* Use g_direct_hash/equal for direct pointer comparisons on func.  */
    helper_table = g_hash_table_new(NULL, NULL);
    s->helper_table = helper_table;

    // Unicorn: Store our custom inline hooks infomation
    s->custom_helper_infos = g_hash_table_new_full(NULL, NULL, NULL, uc_free_inline_hook_info);

    for (i = 0; i < ARRAY_SIZE(all_helpers); ++i) {
        g_hash_table_insert(helper_table, (gpointer)all_helpers[i].func,
                            (gpointer)&all_helpers[i]);
    }

    tcg_target_init(s);
    process_op_defs(s);

    /* Reverse the order of the saved registers, assuming they're all at
       the start of tcg_target_reg_alloc_order.  */
    for (n = 0; n < ARRAY_SIZE(tcg_target_reg_alloc_order); ++n) {
        int r = tcg_target_reg_alloc_order[n];
        if (tcg_regset_test_reg(s->tcg_target_call_clobber_regs, r)) {
            break;
        }
    }
    n = ARRAY_SIZE(tcg_target_reg_alloc_order);
    s->indirect_reg_alloc_order = g_malloc(sizeof(int) * n);
    for (i = 0; i < n; ++i) {
        s->indirect_reg_alloc_order[i] = tcg_target_reg_alloc_order[n - 1 - i];
    }
    for (; i < ARRAY_SIZE(tcg_target_reg_alloc_order); ++i) {
        s->indirect_reg_alloc_order[i] = tcg_target_reg_alloc_order[i];
    }

    s->one_entry = g_malloc(sizeof(struct jit_code_entry));
    s->one_entry->symfile_addr = NULL;

    tcg_debug_assert(!tcg_regset_test_reg(s->reserved_regs, TCG_AREG0));
    ts = tcg_global_reg_new_internal(s, TCG_TYPE_PTR, TCG_AREG0, "env");
    s->cpu_env = temp_tcgv_ptr(s, ts);
}